

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O2

BtorSimBitVector * btorsim_bv_ror(BtorSimBitVector *a,BtorSimBitVector *b)

{
  BtorSimBitVector *b_00;
  BtorSimBitVector *pBVar1;
  BtorSimBitVector *b_01;
  BtorSimBitVector *b_02;
  BtorSimBitVector *pBVar2;
  
  b_00 = btorsim_bv_uint64_to_bv((ulong)a->width,a->width);
  pBVar1 = btorsim_bv_urem(b,b_00);
  b_01 = btorsim_bv_sub(b_00,pBVar1);
  pBVar1 = btorsim_bv_srl(a,pBVar1);
  b_02 = btorsim_bv_sll(a,b_01);
  pBVar2 = btorsim_bv_or(pBVar1,b_02);
  free(b_00);
  free(b_01);
  free(pBVar1);
  free(b_02);
  return pBVar2;
}

Assistant:

BtorSimBitVector *
btorsim_bv_ror (const BtorSimBitVector *a, const BtorSimBitVector *b) {
  BtorSimBitVector *width = btorsim_bv_uint64_to_bv(a->width, a->width);
  BtorSimBitVector *rem = btorsim_bv_urem(b, width);
  BtorSimBitVector *rev = btorsim_bv_sub(width, rem);

  BtorSimBitVector *srl_part = btorsim_bv_srl(a, rem);
  BtorSimBitVector *sll_part = btorsim_bv_sll(a, rev);
  BtorSimBitVector *res = btorsim_bv_or(srl_part, sll_part);

  btorsim_bv_free(width);
  btorsim_bv_free(rev);
  btorsim_bv_free(srl_part);
  btorsim_bv_free(sll_part);
  return res;
}